

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
vkt::pipeline::anon_unknown_0::genTriangleVertices(void)

{
  int iVar1;
  vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *in_RDI;
  Vec4 VVar2;
  allocator<vkt::pipeline::Vertex4RGBA> local_1d [21];
  
  if (pipeline::(anonymous_namespace)::genTriangleVertices()::data == '\0') {
    iVar1 = __cxa_guard_acquire(&pipeline::(anonymous_namespace)::genTriangleVertices()::data);
    if (iVar1 != 0) {
      tcu::Vector<float,_4>::Vector(&genTriangleVertices::data[0].position,-1.0,0.0,0.0,1.0);
      getPrimitiveColor();
      tcu::Vector<float,_4>::Vector(&genTriangleVertices::data[1].position,0.8,0.2,0.0,1.0);
      getPrimitiveColor();
      tcu::Vector<float,_4>::Vector(&genTriangleVertices::data[2].position,0.8,-0.2,0.0,1.0);
      VVar2 = getPrimitiveColor();
      __cxa_guard_release(VVar2.m_data._0_8_,VVar2.m_data._8_8_,
                          &pipeline::(anonymous_namespace)::genTriangleVertices()::data);
    }
  }
  std::allocator<vkt::pipeline::Vertex4RGBA>::allocator(local_1d);
  std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
  vector<vkt::pipeline::Vertex4RGBA_const*,void>
            (in_RDI,genTriangleVertices::data,
             (Vertex4RGBA *)&pipeline::(anonymous_namespace)::genTriangleVertices()::data,local_1d);
  std::allocator<vkt::pipeline::Vertex4RGBA>::~allocator(local_1d);
  return (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)in_RDI;
}

Assistant:

std::vector<Vertex4RGBA> genTriangleVertices (void)
{
	static const Vertex4RGBA data[] =
	{
		{
			Vec4(-1.0f, 0.0f, 0.0f, 1.0f),
			getPrimitiveColor(),
		},
		{
			Vec4(0.8f, 0.2f, 0.0f, 1.0f),
			getPrimitiveColor(),
		},
		{
			Vec4(0.8f, -0.2f, 0.0f, 1.0f),
			getPrimitiveColor(),
		},
	};
	return std::vector<Vertex4RGBA>(data, data + DE_LENGTH_OF_ARRAY(data));
}